

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h.h
# Opt level: O0

void __thiscall
pzgeom::TPZNodeRep<1,_pztopology::TPZPoint>::TPZNodeRep
          (TPZNodeRep<1,_pztopology::TPZPoint> *this,TPZNodeRep<1,_pztopology::TPZPoint> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  bool bVar1;
  TPZRegisterClassId *in_RDI;
  int64_t i;
  size_t in_stack_000003b8;
  char *in_stack_000003c0;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_ffffffffffffff98;
  _Self in_stack_ffffffffffffffb0;
  _Self local_38;
  long local_30;
  key_type_conflict1 *__k;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *this_00;
  
  this_00 = (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)0x0;
  __k = (key_type_conflict1 *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<pzgeom::TPZNodeRep<1,pztopology::TPZPoint>>(in_RDI,0x21);
  pztopology::TPZPoint::TPZPoint((TPZPoint *)in_stack_ffffffffffffffb0._M_node,(void **)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZNodeRep_0244ecb8;
  for (local_30 = 0; local_30 < 1; local_30 = local_30 + 1) {
    local_38._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::find
                   (in_stack_ffffffffffffff98,(key_type_conflict1 *)0x1639884);
    std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
              (in_stack_ffffffffffffff98);
    bVar1 = std::operator==(&local_38,(_Self *)&stack0xffffffffffffffb0);
    if (bVar1) {
      pzinternal::DebugStopImpl(in_stack_000003c0,in_stack_000003b8);
    }
    in_stack_ffffffffffffff98 =
         (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[](this_00,__k);
    *(mapped_type_conflict *)(in_RDI + local_30 * 8 + 8) =
         *(mapped_type_conflict *)&(in_stack_ffffffffffffff98->_M_t)._M_impl;
  }
  return;
}

Assistant:

TPZNodeRep<N,Topology>::TPZNodeRep(const TPZNodeRep<N,Topology> &cp, std::map<int64_t,int64_t> & gl2lcNdMap)
    : TPZRegisterClassId(&TPZNodeRep::ClassId)
	{
		int64_t i;
		for(i = 0; i < N; i++)
		{
			if (gl2lcNdMap.find(cp.fNodeIndexes[i]) == gl2lcNdMap.end())
            {
#ifdef PZ_LOG
                TPZLogger loggernoderep("pz.geom.noderep");
                if (loggernoderep.isErrorEnabled()) {
                  std::stringstream sout;
                  sout << "ERROR in - " << __PRETTY_FUNCTION__
                       << " trying to clone a node " << i << " index "
                       << cp.fNodeIndexes[i] << " which is not mapped";
                  LOGPZ_ERROR(loggernoderep, sout.str().c_str());
                }                                
#endif
				DebugStop();
			}
			fNodeIndexes[i] = gl2lcNdMap [ cp.fNodeIndexes[i] ];
		}
	}